

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
DoInitProperty<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout,Var instance)

{
  code *pcVar1;
  Var playout_00;
  bool bVar2;
  PropertyId pid;
  undefined4 *puVar3;
  RecyclableObject *instance_00;
  InlineCache *pIStack_28;
  PropertyId propertyId;
  InlineCache *inlineCache;
  Var instance_local;
  OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  pIStack_28 = (InlineCache *)0x0;
  inlineCache = (InlineCache *)instance;
  instance_local = playout;
  playout_local = (OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *)this;
  bVar2 = TaggedNumber::Is(instance);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x131c,"(!TaggedNumber::Is(instance))",
                                "!TaggedNumber::Is(instance)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pid = GetPropertyIdFromCacheId(this,*instance_local);
  playout_00 = instance_local;
  instance_00 = UnsafeVarTo<Js::RecyclableObject>(inlineCache);
  bVar2 = TrySetPropertyLocalFastPath<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
                    (this,(OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *)
                          playout_00,pid,instance_00,&stack0xffffffffffffffd8,PropertyOperation_None
                    );
  if (!bVar2) {
    DoInitProperty_NoFastPath<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
              (this,(OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *)
                    instance_local,inlineCache);
  }
  return;
}

Assistant:

void InterpreterStackFrame::DoInitProperty(unaligned T* playout, Var instance)
    {
        // Same fast path as in the backend.

        InlineCache *inlineCache = nullptr;

        Assert(!TaggedNumber::Is(instance));
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        if (TrySetPropertyLocalFastPath(playout, propertyId, UnsafeVarTo<RecyclableObject>(instance), inlineCache))
        {
            return;
        }

        DoInitProperty_NoFastPath(playout, instance);
    }